

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemListView.cpp
# Opt level: O2

QStringList * __thiscall
QFileSystemListView::selection(QStringList *__return_storage_ptr__,QFileSystemListView *this)

{
  QForeachContainer<QList<QModelIndex>_> _container_232;
  QModelIndexList indexes;
  undefined1 auStack_88 [8];
  QForeachContainer<QList<QModelIndex>_> local_80;
  QArrayDataPointer<QModelIndex> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  QAbstractItemView::selectionModel();
  QListView::modelColumn();
  QItemSelectionModel::selectedRows((int)&local_50);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QtPrivate::QForeachContainer<QList<QModelIndex>_>::QForeachContainer
            ((QForeachContainer<QList<QModelIndex>_> *)(auStack_88 + 8),
             (QList<QModelIndex> *)&local_50);
  for (; local_80.i.i != local_80.e.i; local_80.i.i = local_80.i.i + 0x18) {
    QFileSystemModel::fileInfo((QModelIndex *)auStack_88);
    QFileInfo::absoluteFilePath();
    QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QFileInfo::~QFileInfo((QFileInfo *)auStack_88);
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QModelIndex> *)(auStack_88 + 8));
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_50);
  return __return_storage_ptr__;
}

Assistant:

QStringList QFileSystemListView::selection() const {
    const QModelIndexList indexes = selectionModel()->selectedRows(modelColumn());
    QStringList selection;

    foreach (const QModelIndex &index, indexes) {
        selection << d->model->fileInfo(index).absoluteFilePath();
    }

    return selection;
}